

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_REV(DisasContext_conflict1 *s,arg_rr *a)

{
  int iVar1;
  arg_rr *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,3);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    s_local._7_1_ = op_rr(s,a,tcg_gen_bswap32_i32_aarch64);
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_REV(DisasContext *s, arg_rr *a)
{
    if (!ENABLE_ARCH_6) {
        return false;
    }
    return op_rr(s, a, tcg_gen_bswap32_i32);
}